

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_object_ptr __thiscall
APhyBullet::BulletEngine::createSimpleRigidBody
          (BulletEngine *this,aphy_scalar mass,motion_state_ref *motion_state,
          collision_shape_ref *collision_shape,aphy_vector3 param_4)

{
  collision_object *pcVar1;
  btRigidBody *this_00;
  ref<aphy::collision_object> rVar2;
  ref<aphy::collision_object> result;
  btVector3 local_30;
  
  local_30.m_floats._0_8_ = param_4._0_8_;
  rVar2.counter = (collision_object_ptr)0x0;
  if ((motion_state->counter != (Counter *)0x0) && (collision_shape->counter != (Counter *)0x0)) {
    local_30.m_floats[2] = param_4.z;
    local_30.m_floats[3] = 0.0;
    this_00 = (btRigidBody *)btCollisionObject::operator_new(0x2c0);
    btRigidBody::btRigidBody
              (this_00,mass,
               (btMotionState *)
               motion_state->counter->object[1].super_base_interface._vptr_base_interface,
               (btCollisionShape *)
               collision_shape->counter->object[1].super_base_interface._vptr_base_interface,
               &local_30);
    aphy::
    makeObjectWithInterface<aphy::collision_object,APhyBullet::BulletCollisionObject,btRigidBody*,APhyBullet::APhyCollisionObjectType>
              ((aphy *)&result,this_00,RigidBody);
    pcVar1 = (result.counter)->object;
    aphy::ref<aphy::motion_state>::operator=
              ((ref<aphy::motion_state> *)&pcVar1[1].super_base_interface.myRefCounter,motion_state)
    ;
    aphy::ref<aphy::collision_shape>::operator=
              ((ref<aphy::collision_shape> *)(pcVar1 + 2),collision_shape);
    rVar2 = result;
    result.counter = (Counter *)0x0;
    aphy::ref<aphy::collision_object>::~ref(&result);
  }
  return rVar2.counter;
}

Assistant:

collision_object_ptr BulletEngine::createSimpleRigidBody(aphy_scalar mass, const motion_state_ref &motion_state, const collision_shape_ref &collision_shape, aphy_vector3 local_inertia)
{
    if(!motion_state || !collision_shape)
        return nullptr;

    auto inertia = btVector3(local_inertia.x, local_inertia.y, local_inertia.z);
    auto result = makeObject<BulletCollisionObject> (
        new btRigidBody(mass,
            motion_state.as<BulletMotionState> ()->handle,
            collision_shape.as<BulletCollisionShape> ()->handle,
            inertia),
        APhyCollisionObjectType::RigidBody);

    auto collisionObject = result.as<BulletCollisionObject> ();
    collisionObject->motionState = motion_state;
    collisionObject->collisionShape = collision_shape;
    return result.disown();
}